

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expressions.hpp
# Opt level: O2

void __thiscall FunctionReturned::FunctionReturned(FunctionReturned *this,Item *i)

{
  Item::Item(&this->item,i);
  (this->exception).type = Nothing;
  (this->exception).line = -1;
  this->isVoid = false;
  return;
}

Assistant:

FunctionReturned(Item i) : item(i), exception(Nothing), isVoid(false) {}